

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O2

void __thiscall
duckdb::Serializer::WritePropertyWithDefault<duckdb::optional_idx>
          (Serializer *this,field_id_t field_id,char *tag,optional_idx *value)

{
  byte bVar1;
  
  bVar1 = value->index != 0xffffffffffffffff | (byte)this[9];
  if (bVar1 == 0) {
    (**(code **)(*(long *)this + 0x20))(this,field_id,tag,0);
  }
  else {
    (**(code **)(*(long *)this + 0x20))(this,field_id,tag,1);
    WriteValue(this,(optional_idx)value->index);
  }
  (**(code **)(*(long *)this + 0x28))(this,bVar1);
  return;
}

Assistant:

void WritePropertyWithDefault(const field_id_t field_id, const char *tag, const T &value) {
		// If current value is default, don't write it
		if (!options.serialize_default_values && SerializationDefaultValue::IsDefault<T>(value)) {
			OnOptionalPropertyBegin(field_id, tag, false);
			OnOptionalPropertyEnd(false);
			return;
		}
		OnOptionalPropertyBegin(field_id, tag, true);
		WriteValue(value);
		OnOptionalPropertyEnd(true);
	}